

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TLaplaceExample1::uxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *disp)

{
  int iVar1;
  undefined8 *puVar2;
  Fad<double> *pFVar3;
  bool bVar4;
  double dVar5;
  value_type vVar6;
  _func_int **pp_Var7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  undefined8 uVar11;
  int iVar12;
  Fad<double> *pFVar13;
  int64_t iVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  TPZVec<Fad<double>_> **ppTVar19;
  double *pdVar20;
  double *pdVar21;
  int i;
  uint uVar22;
  TPZVec<Fad<double>_> *pTVar23;
  int i_1;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  Fad<double> freq;
  Fad<double> theta;
  Fad<double> mult;
  Fad<double> t;
  Fad<double> temp;
  Fad<double> Prod;
  Fad<double> coef;
  Fad<double> r;
  Fad<double> r2;
  TPZManVector<Fad<double>,_3> xloc;
  undefined1 local_608 [16];
  TPZVec<Fad<double>_> *pTStack_5f8;
  TPZVec<Fad<double>_> *pTStack_5f0;
  undefined1 local_5e8 [12];
  uint uStack_5dc;
  FadCst<int> FStack_5d8;
  TPZVec<Fad<double>_> *pTStack_5d0;
  TPZVec<Fad<double>_> *local_5c8;
  TPZVec<Fad<double>_> local_5c0;
  TPZVec<Fad<double>_> *local_5a0;
  undefined1 local_598 [12];
  uint uStack_58c;
  TPZVec<Fad<double>_> *pTStack_588;
  TPZVec<Fad<double>_> *pTStack_580;
  TPZVec<Fad<double>_> local_570;
  TPZVec<Fad<double>_> local_550;
  TPZVec<Fad<double>_> local_530;
  double local_510;
  TPZVec<Fad<double>_> local_508;
  undefined1 local_4e8 [32];
  TPZVec<Fad<double>_> *local_4c8;
  FadExpr<FadFuncTanh<Fad<double>_>_> *local_4c0;
  undefined1 local_4b8 [16];
  EVP_PKEY_CTX *pEStack_4a8;
  TPZVec<Fad<double>_> *pTStack_4a0;
  TPZVec<Fad<double>_> *local_498;
  uint local_490;
  EVP_PKEY_CTX *local_488;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_480;
  TPZVec<Fad<double>_> *local_478;
  uint local_470;
  EVP_PKEY_CTX *local_468;
  TPZVec<Fad<double>_> *pTStack_460;
  TPZVec<Fad<double>_> *local_458;
  uint local_450;
  EVP_PKEY_CTX *local_448;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_440;
  TPZVec<Fad<double>_> *local_438;
  uint local_430;
  EVP_PKEY_CTX *local_428;
  TPZVec<Fad<double>_> *pTStack_420;
  TPZVec<Fad<double>_> *local_418;
  uint local_410;
  EVP_PKEY_CTX *local_408;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_400;
  TPZVec<Fad<double>_> *local_3f8;
  uint local_3f0;
  EVP_PKEY_CTX *local_3e8;
  TPZVec<Fad<double>_> *pTStack_3e0;
  TPZVec<Fad<double>_> *local_3d8;
  uint local_3d0;
  EVP_PKEY_CTX *local_3c8;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_3c0;
  TPZVec<Fad<double>_> local_3b8;
  undefined1 local_398 [24];
  uint local_380;
  void *local_378;
  undefined8 local_370;
  undefined1 local_368 [24];
  TPZVec<Fad<double>_> *local_350;
  TPZVec<Fad<double>_> local_348;
  undefined1 local_328 [32];
  uint local_308;
  MEM_CPY<double> *local_300;
  undefined8 local_2f8;
  Fad<double> local_2f0;
  Fad<double> local_2d0;
  Fad<double> local_2b0;
  Fad<double> local_290;
  Fad<double> local_270;
  Fad<double> local_250;
  TPZManVector<Fad<double>,_3> local_230;
  Fad<double> local_1b0;
  Fad<double> local_190;
  Fad<double> local_170;
  Fad<double> local_150;
  Fad<double> local_130;
  Fad<double> local_110;
  undefined1 local_f0 [24];
  TPZVec<Fad<double>_> *local_d8;
  Fad<double> local_d0;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_4e8._16_8_ = x;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_230,x);
  if (0 < local_230.super_TPZVec<Fad<double>_>.fNElements) {
    pdVar20 = (this->fCenter).super_TPZVec<double>.fStore;
    lVar24 = 0;
    pTVar23 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    do {
      pTVar23->_vptr_TPZVec = (_func_int **)((double)pTVar23->_vptr_TPZVec - pdVar20[lVar24]);
      lVar24 = lVar24 + 1;
      pTVar23 = pTVar23 + 1;
    } while (local_230.super_TPZVec<Fad<double>_>.fNElements != lVar24);
  }
  local_348._vptr_TPZVec = (_func_int **)0x0;
  local_348.fStore._0_4_ = 0;
  local_348.fNElements = 0;
  local_348.fNAlloc = 0;
  if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
    lVar26 = 0;
    lVar24 = 0;
    do {
      local_4b8._0_8_ = (long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar26;
      local_4b8._8_8_ = local_4b8._0_8_;
      Fad<double>::operator+=
                ((Fad<double> *)&local_348,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_4b8);
      lVar24 = lVar24 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
  }
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt
            ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)&local_348);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,(FadFuncSqrt<Fad<double>_> *)local_5e8
            );
  Fad<double>::~Fad((Fad<double> *)local_5e8);
  dVar30 = 0.0;
  if ((double)local_4b8._8_8_ < 0.0) {
    local_398._16_8_ = sqrt((double)local_4b8._8_8_);
  }
  else {
    local_398._16_8_ = SQRT((double)local_4b8._8_8_);
  }
  uVar16 = (uint)pEStack_4a8;
  local_380 = 0;
  local_378 = (void *)0x0;
  if ((long)(int)(uint)pEStack_4a8 < 1) {
    local_370 = 0;
  }
  else {
    local_380 = (uint)pEStack_4a8;
    uVar27 = (long)(int)(uint)pEStack_4a8 << 3;
    local_378 = operator_new__(uVar27);
    local_370 = 0;
    if (0 < (int)uVar16) {
      uVar25 = 0;
      do {
        ppTVar19 = (TPZVec<Fad<double>_> **)((long)pTStack_4a0 + uVar25);
        if ((uint)pEStack_4a8 == 0) {
          ppTVar19 = &local_498;
        }
        if ((double)local_4b8._8_8_ < 0.0) {
          local_5a0 = *ppTVar19;
          dVar5 = sqrt((double)local_4b8._8_8_);
          pTVar23 = local_5a0;
        }
        else {
          dVar5 = SQRT((double)local_4b8._8_8_);
          pTVar23 = *ppTVar19;
        }
        dVar30 = 0.0;
        *(double *)((long)local_378 + uVar25) = (double)pTVar23 / (dVar5 + dVar5);
        uVar25 = uVar25 + 8;
      } while (uVar27 != uVar25);
    }
  }
  Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
  local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
  local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
  pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
  pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
  local_5e8._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
  unique0x1000675a = (TPZVec<Fad<double>_> *)local_4b8;
  Fad<double>::operator=
            (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_5e8);
  Fad<double>::~Fad((Fad<double> *)local_4b8);
  uVar11 = local_4e8._16_8_;
  puVar2 = *(undefined8 **)(local_4e8._16_8_ + 8);
  local_250.val_ = (double)*puVar2;
  uVar16 = *(uint *)(puVar2 + 1);
  local_250.dx_.ptr_to_data = (double *)0x0;
  local_250.dx_.num_elts = uVar16;
  if ((long)(int)uVar16 != 0) {
    uVar27 = 0xffffffffffffffff;
    if (-1 < (int)uVar16) {
      uVar27 = (long)(int)uVar16 * 8;
    }
    local_250.dx_.ptr_to_data = (double *)operator_new__(uVar27);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_250.dx_.ptr_to_data,(EVP_PKEY_CTX *)puVar2[2],
               (EVP_PKEY_CTX *)(ulong)uVar16);
  }
  local_250.defaultVal = (double)puVar2[3];
  local_5a0 = (TPZVec<Fad<double>_> *)local_250.val_;
  lVar24 = *(long *)(uVar11 + 8);
  local_50.val_ = *(double *)(lVar24 + 0x20);
  uVar16 = *(uint *)(lVar24 + 0x28);
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.dx_.num_elts = uVar16;
  if ((long)(int)uVar16 != 0) {
    uVar27 = 0xffffffffffffffff;
    if (-1 < (int)uVar16) {
      uVar27 = (long)(int)uVar16 * 8;
    }
    local_50.dx_.ptr_to_data = (double *)operator_new__(uVar27);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,*(EVP_PKEY_CTX **)(lVar24 + 0x30),
               (EVP_PKEY_CTX *)(ulong)uVar16);
  }
  local_50.defaultVal = *(double *)(lVar24 + 0x38);
  local_510 = local_50.val_;
  Fad<double>::~Fad(&local_50);
  Fad<double>::~Fad(&local_250);
  pFVar3 = local_230.super_TPZVec<Fad<double>_>.fStore;
  uVar22 = (uint)local_348.fStore;
  uVar17 = local_380;
  uVar18 = uStack_58c;
  uVar16 = local_5c0.fStore._4_4_;
  switch(this->fExact) {
  case EConst:
    disp->fStore->val_ = gC + disp->fStore->val_;
    break;
  case EX:
    pFVar3 = disp->fStore;
    iVar1 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    lVar24 = (long)iVar1;
    if (lVar24 != 0) {
      uVar16 = (pFVar3->dx_).num_elts;
      pdVar20 = *(double **)((long)local_230.super_TPZVec<Fad<double>_>.fStore + 0x10);
      if ((ulong)uVar16 == 0) {
        (pFVar3->dx_).num_elts = iVar1;
        uVar27 = 0xffffffffffffffff;
        if (-1 < iVar1) {
          uVar27 = lVar24 * 8;
        }
        pdVar21 = (double *)operator_new__(uVar27);
        (pFVar3->dx_).ptr_to_data = pdVar21;
        if (0 < iVar1) {
          lVar26 = 0;
          do {
            pdVar21[lVar26] = pdVar20[lVar26];
            lVar26 = lVar26 + 1;
          } while (lVar24 != lVar26);
        }
      }
      else if (0 < (int)uVar16) {
        pdVar21 = (pFVar3->dx_).ptr_to_data;
        uVar27 = 0;
        do {
          pdVar21[uVar27] = pdVar20[uVar27] + pdVar21[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar16 != uVar27);
      }
    }
    pFVar3->val_ = (double)(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + pFVar3->val_;
    break;
  case ESinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar24 = 0;
      lVar26 = 0;
      do {
        local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        FStack_5d8 = (FadCst<int>)
                     ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar24);
        unique0x100067aa = (TPZVec<Fad<double>_> *)local_4b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_4b8);
        lVar26 = lVar26 + 1;
        lVar24 = lVar24 + 0x20;
      } while (lVar26 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case ECosCos:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar26 = 0;
      lVar24 = 0;
      do {
        local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar26);
        FStack_5d8.constant_ = 2;
        FStack_5d8.defaultVal = 0;
        unique0x100067a2 = (TPZVec<Fad<double>_> *)local_598;
        local_598._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
                    *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_4b8);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case EArcTan:
    local_4b8._0_8_ = (Fad<double> *)0x3fe0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    local_598._0_8_ = ((double)local_398._16_8_ + -0.5) * 100.0;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)((ulong)uStack_58c << 0x20);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    if (0 < (int)local_380) {
      stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)CONCAT44(uVar18,local_380);
      uVar27 = (ulong)local_380;
      pTStack_588 = (TPZVec<Fad<double>_> *)operator_new__(uVar27 * 8);
      if (0 < (int)uVar17) {
        uVar25 = 0;
        do {
          (&pTStack_588->_vptr_TPZVec)[uVar25] =
               (_func_int **)
               ((*(double *)((long)local_378 + uVar25 * 8) - (double)pTStack_4a0) * 100.0);
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
    }
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    local_4c0 = (FadExpr<FadFuncTanh<Fad<double>_>_> *)local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4024000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3fd3333333333333;
    stack0xfffffffffffffa20 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_368._0_8_ = &local_550;
    local_550._vptr_TPZVec = (_func_int **)0x400921fb54442d18;
    local_550.fStore = (Fad<double> *)((ulong)local_550.fStore._4_4_ << 0x20);
    local_550.fNElements = 0;
    local_550.fNAlloc = 0;
    local_3b8.fStore = (Fad<double> *)local_368;
    local_368._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_350 = &local_3b8;
    local_398._8_8_ = local_368 + 0x10;
    local_368._16_8_ = local_5e8;
    local_4e8._0_8_ = local_398;
    local_328._0_8_ = &local_570;
    local_570._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
    local_570.fStore = (Fad<double> *)((ulong)local_570.fStore._4_4_ << 0x20);
    local_570.fNElements = 0;
    local_570.fNAlloc = 0;
    local_f0._16_8_ = &local_508;
    local_508._vptr_TPZVec = (_func_int **)0x3fe0000000000000;
    local_508.fStore = (Fad<double> *)((ulong)local_508.fStore._4_4_ << 0x20);
    local_508.fNElements = 0;
    local_508.fNAlloc = 0;
    local_f0._0_8_ = &local_530;
    local_530._vptr_TPZVec = (_func_int **)0x400921fb54442d18;
    local_530.fStore = (Fad<double> *)((ulong)local_530.fStore._4_4_ << 0x20);
    local_530.fNElements = 0;
    local_530.fNAlloc = 0;
    local_4c8 = (TPZVec<Fad<double>_> *)local_f0;
    local_f0._8_8_ = local_398 + 0x10;
    local_d8 = (TPZVec<Fad<double>_> *)(local_4e8 + 0x18);
    local_328._8_8_ = local_f0 + 0x10;
    local_4e8._8_8_ = local_328;
    local_3b8.fNElements = (int64_t)local_4c0;
    local_398._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    local_5c0._vptr_TPZVec =
         (_func_int **)
         FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
         ::val((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                *)local_4e8);
    uVar18 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
             ::size((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                     *)local_4e8);
    uVar16 = local_5c0.fStore._4_4_;
    local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore._4_4_ << 0x20);
    local_5c0.fNElements = 0;
    if (0 < (int)uVar18) {
      local_5c0.fStore = (Fad<double> *)CONCAT44(uVar16,uVar18);
      local_5c0.fNElements = (int64_t)operator_new__((ulong)uVar18 << 3);
    }
    local_5c0.fNAlloc = 0;
    uVar16 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
             ::size((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                     *)local_4e8);
    if (0 < (int)uVar16) {
      uVar27 = 0;
      do {
        pp_Var7 = (_func_int **)
                  FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                  ::dx((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                        *)local_4e8,(int)uVar27);
        ((_func_int ***)local_5c0.fNElements)[uVar27] = pp_Var7;
        uVar27 = uVar27 + 1;
      } while (uVar16 != uVar27);
    }
    Fad<double>::~Fad((Fad<double> *)&local_530);
    Fad<double>::~Fad((Fad<double> *)&local_508);
    Fad<double>::~Fad((Fad<double> *)&local_570);
    Fad<double>::~Fad((Fad<double> *)&local_550);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    FadFuncAtan<Fad<double>_>::FadFuncAtan
              ((FadFuncAtan<Fad<double>_> *)local_5e8,(Fad<double> *)local_598);
    FadExpr<FadFuncAtan<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncAtan<Fad<double>_>_> *)local_4b8,
               (FadFuncAtan<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_550.fStore = (Fad<double> *)&local_5c0;
    local_550._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *)
               &local_550);
    pTVar23 = (TPZVec<Fad<double>_> *)(local_4b8 + 8);
    goto LAB_0140a21a;
  case EArcTanSingular:
    iVar1 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
    if (iVar1 == 1) {
      uVar28 = 0;
      uVar29 = 0x3ff40000;
    }
    else {
      uVar28 = (undefined4)*(undefined8 *)(&DAT_015a3070 + (ulong)(iVar1 == 3) * 8);
      uVar29 = (undefined4)((ulong)*(undefined8 *)(&DAT_015a3070 + (ulong)(iVar1 == 3) * 8) >> 0x20)
      ;
    }
    local_5a0 = (TPZVec<Fad<double>_> *)CONCAT44(uVar29,uVar28);
    unique0x00005300 = &local_348;
    local_550._vptr_TPZVec = (_func_int **)local_598;
    local_598._0_8_ = (TPZVec<Fad<double>_> *)0x3fe0000000000000;
    stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)((ulong)uStack_58c << 0x20);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_4b8._0_8_ = local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4034000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = &local_550;
    local_5c0._vptr_TPZVec = (_func_int **)((0.25 - (double)local_348._vptr_TPZVec) * 20.0);
    local_4b8._8_8_ = local_5e8;
    local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore._4_4_ << 0x20);
    local_5c0.fNElements = 0;
    local_550.fStore = (Fad<double> *)local_550._vptr_TPZVec;
    if ((int)(uint)local_348.fStore < 1) {
      local_5c0.fNAlloc = 0;
    }
    else {
      local_5c0.fStore = (Fad<double> *)CONCAT44(uVar16,(uint)local_348.fStore);
      uVar27 = (ulong)(uint)local_348.fStore;
      local_5c0.fNElements = (int64_t)operator_new__(uVar27 * 8);
      local_5c0.fNAlloc = 0;
      if (0 < (int)uVar22) {
        uVar25 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                    ::dx((FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                          *)local_4b8,(int)uVar25);
          ((_func_int ***)local_5c0.fNElements)[uVar25] = pp_Var7;
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
    }
    local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
    local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
    local_550.fNElements = 0;
    local_550.fNAlloc = 0;
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar26 = 0;
      lVar24 = 0;
      do {
        local_5e8._0_8_ = *(long *)(local_4e8._16_8_ + 8) + lVar26;
        local_4b8._8_8_ = (Fad<double> *)0x3ff0000000000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        unique0x1000679a = (TPZVec<Fad<double>_> *)local_4b8;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
        Fad<double>::operator*=
                  ((Fad<double> *)&local_550,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)local_5e8);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    FadFuncAtan<Fad<double>_>::FadFuncAtan
              ((FadFuncAtan<Fad<double>_> *)local_5e8,(Fad<double> *)&local_5c0);
    FadExpr<FadFuncAtan<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncAtan<Fad<double>_>_> *)local_4b8,
               (FadFuncAtan<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    dVar30 = atan((double)local_4b8._8_8_);
    uVar16 = local_570.fStore._4_4_;
    local_570._vptr_TPZVec = (_func_int **)(dVar30 + 1.5707963267948966);
    iVar1 = (uint)pEStack_4a8;
    lVar24 = (long)(int)(uint)pEStack_4a8;
    local_570.fStore = (Fad<double> *)((ulong)local_570.fStore._4_4_ << 0x20);
    local_570.fNElements = 0;
    if (0 < lVar24) {
      local_570.fStore = (Fad<double> *)CONCAT44(uVar16,(uint)pEStack_4a8);
      local_570.fNElements = (int64_t)operator_new__(lVar24 * 8);
    }
    local_570.fNAlloc = 0;
    if (0 < iVar1) {
      lVar26 = 0;
      do {
        ((_func_int ***)local_570.fNElements)[lVar26] =
             (_func_int **)
             ((double)(&pTStack_4a0->_vptr_TPZVec)[lVar26] /
             ((double)local_4b8._8_8_ * (double)local_4b8._8_8_ + 1.0));
        lVar26 = lVar26 + 1;
      } while (lVar24 != lVar26);
    }
    Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
    pFVar3 = disp->fStore;
    iVar12 = (int)local_570.fStore;
    uVar27 = (ulong)local_570.fStore & 0xffffffff;
    iVar1 = (pFVar3->dx_).num_elts;
    if ((int)local_570.fStore != iVar1) {
      if ((int)local_570.fStore == 0) {
        if (iVar1 != 0) {
          pdVar20 = (pFVar3->dx_).ptr_to_data;
          if (pdVar20 != (double *)0x0) {
            operator_delete__(pdVar20);
          }
          (pFVar3->dx_).num_elts = 0;
          (pFVar3->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar24 = (long)(int)local_570.fStore;
        if (iVar1 != 0) {
          pdVar20 = (pFVar3->dx_).ptr_to_data;
          if (pdVar20 != (double *)0x0) {
            operator_delete__(pdVar20);
          }
          (pFVar3->dx_).num_elts = 0;
          (pFVar3->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar3->dx_).num_elts = iVar12;
        uVar25 = 0xffffffffffffffff;
        if (-1 < iVar12) {
          uVar25 = lVar24 << 3;
        }
        pdVar20 = (double *)operator_new__(uVar25);
        (pFVar3->dx_).ptr_to_data = pdVar20;
      }
    }
    if (iVar12 != 0) {
      pdVar20 = (pFVar3->dx_).ptr_to_data;
      if ((int)local_570.fStore == 0) {
        if (0 < iVar12) {
          uVar25 = 0;
          do {
            pdVar20[uVar25] = (double)local_570.fNAlloc * (double)local_5a0;
            uVar25 = uVar25 + 1;
          } while (uVar27 != uVar25);
        }
      }
      else if (0 < iVar12) {
        uVar25 = 0;
        do {
          pdVar20[uVar25] =
               (double)((_func_int ***)local_570.fNElements)[uVar25] * (double)local_5a0;
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
    }
    pFVar3->val_ = (double)local_5a0 * (double)local_570._vptr_TPZVec;
    Fad<double>::~Fad((Fad<double> *)&local_570);
    pTVar23 = &local_550;
LAB_0140a21a:
    Fad<double>::~Fad((Fad<double> *)pTVar23);
    pTVar23 = &local_5c0;
    goto LAB_0140a224;
  case ESinDist:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar26 = 0;
      lVar24 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar26);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x3ff199999999999a;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_598._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (Fad<double> *)local_598;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case E10SinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar26 = 0;
      lVar24 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar26);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x4024000000000000;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_598._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (Fad<double> *)local_598;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case E2SinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar26 = 0;
      lVar24 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar26);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x4000000000000000;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_598._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (Fad<double> *)local_598;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar24 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case ESinSinDirNonHom:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5c0.fStore = (Fad<double> *)&local_550;
    local_550.fStore = (Fad<double> *)0x4000000000000000;
    local_550.fNElements = 0;
    local_3b8._vptr_TPZVec = (_func_int **)&local_5c0;
    local_5c0.fNElements = (int64_t)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_570.fStore = (Fad<double> *)&local_508;
    local_508._vptr_TPZVec = (_func_int **)local_5e8;
    local_508.fStore = (Fad<double> *)0x4000000000000000;
    local_508.fNElements = 0;
    local_570.fNElements = (int64_t)(local_230.super_TPZVec<Fad<double>_>.fStore + 1);
    local_3b8.fStore = (Fad<double> *)&local_570;
    local_530._vptr_TPZVec = (_func_int **)&local_3b8;
    local_4e8._24_8_ = local_598;
    local_598._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)((ulong)uStack_58c << 0x20);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_4e8._0_8_ = local_398;
    local_398._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_4e8._8_8_ = local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_4c8 = (TPZVec<Fad<double>_> *)local_4e8;
    local_530.fStore = (Fad<double> *)(local_4e8 + 0x18);
    local_550._vptr_TPZVec = (_func_int **)local_4b8;
    local_398._8_8_ = local_570.fNElements;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)&local_530);
    goto LAB_01409c79;
  case ESinMark:
    local_270.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar16 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_270.dx_.ptr_to_data = (double *)0x0;
    local_270.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_270.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_270.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_270.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNAlloc;
    local_110.val_ = (local_230.super_TPZVec<Fad<double>_>.fStore)->val_;
    uVar16 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    local_110.dx_.ptr_to_data = (double *)0x0;
    local_110.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_110.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_110.dx_.ptr_to_data,
                 *(EVP_PKEY_CTX **)((long)local_230.super_TPZVec<Fad<double>_>.fStore + 0x10),
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_110.defaultVal = (local_230.super_TPZVec<Fad<double>_>.fStore)->defaultVal;
    atan2(local_110.defaultVal,dVar30);
    Fad<double>::~Fad(&local_110);
    Fad<double>::~Fad(&local_270);
    uVar11 = local_4b8._8_8_;
    local_70.val_ = (double)local_4b8._0_8_;
    local_70.dx_.num_elts = local_4b8._8_4_;
    local_70.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_4b8._8_4_ != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)local_4b8._8_4_) {
        uVar27 = (long)(int)local_4b8._8_4_ * 8;
      }
      local_70.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_70.dx_.ptr_to_data,pEStack_4a8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_70.defaultVal = (double)pTStack_4a0;
    local_4e8._16_8_ = local_70.val_;
    Fad<double>::~Fad(&local_70);
    if ((double)local_4e8._16_8_ < 0.0) {
      local_4b8._0_8_ = (double)local_4b8._0_8_ + 6.283185307179586;
    }
    if (((local_510 <= -1e-15) || ((double)local_5a0 <= 0.0)) || (1e-15 <= local_510)) {
      local_550._vptr_TPZVec = (_func_int **)local_598;
      local_598._0_8_ = (Fad<double> *)0x4000000000000000;
      stack0xfffffffffffffa70 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
      pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
      local_550.fStore = (Fad<double> *)local_608;
      local_608._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x4008000000000000;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      local_5c0.fStore = (Fad<double> *)&local_550;
      local_5c0._vptr_TPZVec = (_func_int **)(local_398 + 0x10);
      local_5e8._0_8_ = pow((double)local_398._16_8_,0.6666666666666666);
      pFVar3 = local_5c0.fStore;
      pp_Var7 = local_5c0._vptr_TPZVec;
      pTVar23 = stack0xfffffffffffffa20;
      uVar16 = ((*(Fad<double> **)&(local_5c0.fStore)->dx_)->dx_).num_elts;
      if ((int)uVar16 < (int)*(uint *)((_func_int **)(local_5c0.fStore)->val_ + 1)) {
        uVar16 = *(uint *)((_func_int **)(local_5c0.fStore)->val_ + 1);
      }
      uVar18 = ((Vector<double> *)((long)local_5c0._vptr_TPZVec + 8))->num_elts;
      if ((int)uVar16 < (int)uVar18) {
        uVar16 = uVar18;
      }
      stack0xfffffffffffffa20 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
      FStack_5d8.constant_ = 0;
      FStack_5d8.defaultVal = 0;
      if (0 < (int)uVar16) {
        uStack_5dc = SUB84(pTVar23,4);
        stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5dc,uVar16);
        FStack_5d8 = (FadCst<int>)operator_new__((ulong)uVar16 << 3);
      }
      pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
      uVar16 = ((Vector<double> *)((long)pp_Var7 + 8))->num_elts;
      uVar18 = *(uint *)((_func_int **)pFVar3->val_ + 1);
      uVar17 = ((*(Fad<double> **)&pFVar3->dx_)->dx_).num_elts;
      if ((int)uVar17 < (int)uVar18) {
        uVar17 = uVar18;
      }
      if ((int)uVar17 < (int)uVar16) {
        uVar17 = uVar16;
      }
      if (0 < (int)uVar17) {
        uVar27 = 0;
        do {
          vVar10 = FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>::dx
                             ((FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>
                               *)&local_5c0,(int)uVar27);
          *(value_type *)((long)FStack_5d8 + uVar27 * 8) = vVar10;
          uVar27 = uVar27 + 1;
        } while (uVar17 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_598);
      local_598._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
      stack0xfffffffffffffa70 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
      pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
      local_5c0.fStore = (Fad<double> *)&local_570;
      local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4008000000000000;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      local_550.fStore = (Fad<double> *)&local_5c0;
      local_550._vptr_TPZVec = (_func_int **)local_5e8;
      local_5c0.fNElements = (int64_t)local_608;
      local_570._vptr_TPZVec = (_func_int **)local_598;
      local_570.fStore = (Fad<double> *)local_4b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)&local_550);
      goto LAB_01409c79;
    }
    pFVar3 = disp->fStore;
    pFVar3->val_ = 0.0;
    if ((pFVar3->dx_).num_elts != 0) {
      local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar3->dx_,(double *)local_5e8);
    }
    goto LAB_01409c9a;
  case ESteklovNonConst:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_498 = (TPZVec<Fad<double>_> *)0x3fdc9f25c5bfedd8;
    local_490 = 0;
    local_488 = (EVP_PKEY_CTX *)0x0;
    pFStack_480 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_478 = (TPZVec<Fad<double>_> *)0x4002aaaaaaaaaaa9;
    local_470 = 0;
    local_468 = (EVP_PKEY_CTX *)0x0;
    pTStack_460 = (TPZVec<Fad<double>_> *)0x0;
    local_458 = (TPZVec<Fad<double>_> *)0xbfe7d9f4cf754632;
    local_450 = 0;
    local_448 = (EVP_PKEY_CTX *)0x0;
    pFStack_440 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_438 = (TPZVec<Fad<double>_> *)0x3fe1c71c71c71c72;
    local_430 = 0;
    local_428 = (EVP_PKEY_CTX *)0x0;
    pTStack_420 = (TPZVec<Fad<double>_> *)0x0;
    local_418 = (TPZVec<Fad<double>_> *)0xbfee363617d8d064;
    local_410 = 0;
    local_408 = (EVP_PKEY_CTX *)0x0;
    pFStack_400 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_3f8 = (TPZVec<Fad<double>_> *)0xbfded097b425ed0e;
    local_3f0 = 0;
    local_3e8 = (EVP_PKEY_CTX *)0x0;
    pTStack_3e0 = (TPZVec<Fad<double>_> *)0x0;
    local_3d8 = (TPZVec<Fad<double>_> *)0xc00336afe00206c6;
    local_3d0 = 0;
    local_3c8 = (EVP_PKEY_CTX *)0x0;
    pFStack_3c0 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3fe122550cc9a902;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_290.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar16 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_290.dx_.ptr_to_data = (double *)0x0;
    local_290.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_290.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_290.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_290.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNAlloc;
    local_130.val_ = (local_230.super_TPZVec<Fad<double>_>.fStore)->val_;
    uVar16 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    local_130.dx_.ptr_to_data = (double *)0x0;
    local_130.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_130.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_130.dx_.ptr_to_data,
                 *(EVP_PKEY_CTX **)((long)local_230.super_TPZVec<Fad<double>_>.fStore + 0x10),
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_130.defaultVal = (local_230.super_TPZVec<Fad<double>_>.fStore)->defaultVal;
    atan2(local_130.defaultVal,dVar30);
    Fad<double>::~Fad(&local_130);
    Fad<double>::~Fad(&local_290);
    pTVar23 = stack0xfffffffffffffa70;
    local_90.val_ = (double)local_598._0_8_;
    local_90.dx_.num_elts = local_598._8_4_;
    local_90.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_598._8_4_ != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)local_598._8_4_) {
        uVar27 = (long)(int)local_598._8_4_ * 8;
      }
      local_90.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_588,
                 (EVP_PKEY_CTX *)((ulong)pTVar23 & 0xffffffff));
    }
    local_90.defaultVal = (double)pTStack_580;
    local_4e8._16_8_ = local_90.val_;
    Fad<double>::~Fad(&local_90);
    uVar11 = local_4b8._8_8_;
    if ((double)local_4e8._16_8_ < 0.0) {
      local_598._0_8_ = (double)local_598._0_8_ + 6.283185307179586;
    }
    if ((0.0 <= (double)local_5a0) && (0.0 <= local_510)) {
      local_530._vptr_TPZVec = (_func_int **)(local_398 + 0x10);
      local_530.fStore = (Fad<double> *)local_5e8;
      local_608._0_8_ = local_4b8._0_8_;
      local_608._8_4_ = local_4b8._8_4_;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if ((long)(int)local_4b8._8_4_ != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_4b8._8_4_) {
          uVar27 = (long)(int)local_4b8._8_4_ * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,pEStack_4a8,(EVP_PKEY_CTX *)(uVar11 & 0xffffffff))
        ;
      }
      uVar16 = local_490;
      local_4e8._24_8_ = local_608;
      pTStack_5f0 = pTStack_4a0;
      local_4c8 = &local_550;
      local_550.fStore = (Fad<double> *)local_5e8;
      local_5c0._vptr_TPZVec = (_func_int **)local_498;
      local_5c0.fStore = (Fad<double> *)CONCAT44(local_5c0.fStore._4_4_,local_490);
      local_5c0.fNElements = 0;
      local_550.fNElements = (int64_t)local_598;
      if ((long)(int)local_490 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_490) {
          uVar27 = (long)(int)local_490 * 8;
        }
        local_5c0.fNElements = (int64_t)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_5c0.fNElements,local_488,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      local_4e8._0_8_ = &local_5c0;
      local_5c0.fNAlloc = (int64_t)pFStack_480;
      local_4e8._8_8_ = &local_570;
      local_570.fStore = (Fad<double> *)local_5e8;
      local_3b8.fStore = (Fad<double> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_508.fStore = (Fad<double> *)&local_3b8;
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_570.fNElements = (int64_t)local_598;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar16 = local_470;
    if (((double)local_5a0 <= 0.0) && (0.0 <= local_510)) {
      local_530._vptr_TPZVec = (_func_int **)(local_398 + 0x10);
      local_530.fStore = (Fad<double> *)local_5e8;
      local_608._0_8_ = local_478;
      local_608._8_4_ = local_470;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if ((long)(int)local_470 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_470) {
          uVar27 = (long)(int)local_470 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_468,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      uVar16 = local_450;
      local_4e8._24_8_ = local_608;
      pTStack_5f0 = pTStack_460;
      local_4c8 = &local_550;
      local_550.fStore = (Fad<double> *)local_5e8;
      local_5c0._vptr_TPZVec = (_func_int **)local_458;
      local_5c0.fStore = (Fad<double> *)CONCAT44(local_5c0.fStore._4_4_,local_450);
      local_5c0.fNElements = 0;
      local_550.fNElements = (int64_t)local_598;
      if ((long)(int)local_450 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_450) {
          uVar27 = (long)(int)local_450 * 8;
        }
        local_5c0.fNElements = (int64_t)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_5c0.fNElements,local_448,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      local_4e8._0_8_ = &local_5c0;
      local_5c0.fNAlloc = (int64_t)pFStack_440;
      local_4e8._8_8_ = &local_570;
      local_570.fStore = (Fad<double> *)local_5e8;
      local_3b8.fStore = (Fad<double> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_508.fStore = (Fad<double> *)&local_3b8;
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_570.fNElements = (int64_t)local_598;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar16 = local_430;
    if (((double)local_5a0 < 0.0) && (local_510 <= 0.0)) {
      local_530._vptr_TPZVec = (_func_int **)(local_398 + 0x10);
      local_530.fStore = (Fad<double> *)local_5e8;
      local_608._0_8_ = local_438;
      local_608._8_4_ = local_430;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if ((long)(int)local_430 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_430) {
          uVar27 = (long)(int)local_430 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_428,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      uVar16 = local_410;
      local_4e8._24_8_ = local_608;
      pTStack_5f0 = pTStack_420;
      local_4c8 = &local_550;
      local_550.fStore = (Fad<double> *)local_5e8;
      local_5c0._vptr_TPZVec = (_func_int **)local_418;
      local_5c0.fStore = (Fad<double> *)CONCAT44(local_5c0.fStore._4_4_,local_410);
      local_5c0.fNElements = 0;
      local_550.fNElements = (int64_t)local_598;
      if ((long)(int)local_410 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_410) {
          uVar27 = (long)(int)local_410 * 8;
        }
        local_5c0.fNElements = (int64_t)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_5c0.fNElements,local_408,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      local_4e8._0_8_ = &local_5c0;
      local_5c0.fNAlloc = (int64_t)pFStack_400;
      local_4e8._8_8_ = &local_570;
      local_570.fStore = (Fad<double> *)local_5e8;
      local_3b8.fStore = (Fad<double> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_508.fStore = (Fad<double> *)&local_3b8;
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_570.fNElements = (int64_t)local_598;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar16 = local_3f0;
    if ((0.0 <= (double)local_5a0) && (local_510 < 0.0)) {
      local_530._vptr_TPZVec = (_func_int **)(local_398 + 0x10);
      local_530.fStore = (Fad<double> *)local_5e8;
      local_608._0_8_ = local_3f8;
      local_608._8_4_ = local_3f0;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if ((long)(int)local_3f0 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_3f0) {
          uVar27 = (long)(int)local_3f0 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_3e8,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      uVar16 = local_3d0;
      local_4e8._24_8_ = local_608;
      pTStack_5f0 = pTStack_3e0;
      local_4c8 = &local_550;
      local_550.fStore = (Fad<double> *)local_5e8;
      local_5c0._vptr_TPZVec = (_func_int **)local_3d8;
      local_5c0.fStore = (Fad<double> *)CONCAT44(local_5c0.fStore._4_4_,local_3d0);
      local_5c0.fNElements = 0;
      local_550.fNElements = (int64_t)local_598;
      if ((long)(int)local_3d0 != 0) {
        uVar27 = 0xffffffffffffffff;
        if (-1 < (int)local_3d0) {
          uVar27 = (long)(int)local_3d0 * 8;
        }
        local_5c0.fNElements = (int64_t)operator_new__(uVar27);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_5c0.fNElements,local_3c8,(EVP_PKEY_CTX *)(ulong)uVar16);
      }
      local_4e8._0_8_ = &local_5c0;
      local_5c0.fNAlloc = (int64_t)pFStack_3c0;
      local_4e8._8_8_ = &local_570;
      local_570.fStore = (Fad<double> *)local_5e8;
      local_3b8.fStore = (Fad<double> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_508.fStore = (Fad<double> *)&local_3b8;
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_570.fNElements = (int64_t)local_598;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    Fad<double>::~Fad((Fad<double> *)local_598);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    lVar24 = 0xe0;
    do {
      Fad<double>::~Fad((Fad<double> *)(local_4b8 + lVar24));
      lVar24 = lVar24 + -0x20;
    } while (lVar24 != -0x20);
    break;
  case EGalvisNonConst:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x4014000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    if (((double)local_5a0 <= 0.0) && (local_510 <= 0.0)) {
      local_508.fStore = (Fad<double> *)&local_5c0;
      local_5c0._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore._4_4_ << 0x20);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
      local_550.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_570._vptr_TPZVec = (_func_int **)local_4b8;
      local_570.fStore = (Fad<double> *)0x3ff0000000000000;
      local_570.fNElements = 0;
      pTStack_5f0 = &local_508;
      local_550.fNElements = (int64_t)&local_570;
      local_598._0_8_ =
           sin((((double)(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + 1.0) *
               3.141592653589793) / 3.0);
      iVar14 = local_550.fNElements;
      pFVar3 = local_550.fStore;
      pTVar23 = stack0xfffffffffffffa70;
      uVar16 = *(uint *)(*(long *)(local_550.fStore)->defaultVal + 8);
      uVar18 = *(uint *)(((long *)(local_550.fStore)->defaultVal)[1] + 8);
      if ((int)uVar18 < (int)uVar16) {
        uVar18 = uVar16;
      }
      if ((int)uVar18 <= (int)*(uint *)(*(_func_int ***)local_550.fNElements + 1)) {
        uVar18 = *(uint *)(*(_func_int ***)local_550.fNElements + 1);
      }
      stack0xfffffffffffffa70 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
      pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar18) {
        uStack_58c = SUB84(pTVar23,4);
        stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_58c,uVar18);
        pTStack_588 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar18 << 3);
      }
      pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
      uVar16 = *(uint *)(*(long *)pFVar3->defaultVal + 8);
      uVar18 = *(uint *)(((long *)pFVar3->defaultVal)[1] + 8);
      if ((int)uVar18 < (int)uVar16) {
        uVar18 = uVar16;
      }
      if ((int)uVar18 <= (int)*(uint *)(*(_func_int ***)iVar14 + 1)) {
        uVar18 = *(uint *)(*(_func_int ***)iVar14 + 1);
      }
      if (0 < (int)uVar18) {
        uVar27 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                    ::dx((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                          *)&local_550,(int)uVar27);
          (&pTStack_588->_vptr_TPZVec)[uVar27] = pp_Var7;
          uVar27 = uVar27 + 1;
        } while (uVar18 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_4e8._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e8._8_8_ = &local_550;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_3b8.fStore = (Fad<double> *)local_398;
      local_398._0_8_ = local_5e8;
      local_530._vptr_TPZVec = (_func_int **)&local_3b8;
      local_570._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_570.fStore = (Fad<double> *)((ulong)local_570.fStore & 0xffffffff00000000);
      local_570.fNElements = 0;
      local_570.fNAlloc = 0;
      local_368._16_8_ = local_368;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_350 = (TPZVec<Fad<double>_> *)local_328;
      local_530.fStore = (Fad<double> *)(local_368 + 0x10);
      local_4e8._24_8_ = &local_5c0;
      local_398._8_8_ = local_4e8._0_8_;
      local_368._0_8_ = local_398._0_8_;
      local_368._8_8_ = &local_570;
      local_328._0_8_ = local_398._0_8_;
      local_328._8_8_ = &local_508;
      local_608._0_8_ =
           FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
           ::val((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                  *)&local_530);
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar16) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar16;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar16 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      if (0 < (int)uVar16) {
        uVar27 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_530,(int)uVar27);
          (&pTStack_5f8->_vptr_TPZVec)[uVar27] = pp_Var7;
          uVar27 = uVar27 + 1;
        } while (uVar16 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)local_598;
      local_5c0.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_598);
    }
    if ((0.0 < (double)local_5a0) && (local_510 < 0.0)) {
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_530._vptr_TPZVec = (_func_int **)local_4b8;
      local_530.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
      local_508.fStore = (Fad<double> *)&local_5c0;
      local_5c0._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      pTStack_5f0 = &local_508;
      local_570.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_3b8.fStore = (Fad<double> *)&local_550;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_570.fNElements = (int64_t)&local_3b8;
      local_3b8._vptr_TPZVec = local_530._vptr_TPZVec;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_598,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_4e8._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_3b8.fStore = (Fad<double> *)local_398;
      local_398._0_8_ = local_5e8;
      local_570._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_570.fStore = (Fad<double> *)((ulong)local_570.fStore & 0xffffffff00000000);
      local_570.fNElements = 0;
      local_570.fNAlloc = 0;
      local_368._16_8_ = local_368;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_350 = (TPZVec<Fad<double>_> *)local_328;
      local_328._8_8_ = &local_508;
      local_530.fStore = (Fad<double> *)(local_368 + 0x10);
      local_530._vptr_TPZVec = (_func_int **)&local_3b8;
      local_4e8._8_8_ = &local_550;
      local_4e8._24_8_ = &local_5c0;
      local_398._8_8_ = local_4e8._0_8_;
      local_368._0_8_ = local_398._0_8_;
      local_368._8_8_ = &local_570;
      local_328._0_8_ = local_398._0_8_;
      local_608._0_8_ =
           FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
           ::val((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                  *)&local_530);
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar16) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar16;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar16 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      if (0 < (int)uVar16) {
        uVar27 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_530,(int)uVar27);
          (&pTStack_5f8->_vptr_TPZVec)[uVar27] = pp_Var7;
          uVar27 = uVar27 + 1;
        } while (uVar16 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)local_598;
      local_5c0.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_598);
    }
    if (((double)local_5a0 < 0.0) && (0.0 <= local_510)) {
      local_508.fStore = (Fad<double> *)&local_5c0;
      local_5c0._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
      local_570.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_530.fStore = (Fad<double> *)&local_550;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_570.fNElements = (int64_t)&local_530;
      local_530._vptr_TPZVec = (_func_int **)local_4b8;
      pTStack_5f0 = &local_508;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_598,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_398._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e8._0_8_ = local_398;
      local_398._0_8_ = local_5e8;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_350 = (TPZVec<Fad<double>_> *)local_368;
      local_3b8.fStore = (Fad<double> *)(local_368 + 0x10);
      local_530._vptr_TPZVec = (_func_int **)&local_3b8;
      local_570._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_570.fStore = (Fad<double> *)((ulong)local_570.fStore & 0xffffffff00000000);
      local_570.fNElements = 0;
      local_570.fNAlloc = 0;
      local_328._0_8_ = local_f0 + 0x10;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_328._8_8_ = local_f0;
      local_530.fStore = (Fad<double> *)local_328;
      local_4e8._8_8_ = &local_550;
      local_4e8._24_8_ = &local_5c0;
      local_368._0_8_ = local_398._0_8_;
      local_368._8_8_ = local_398._8_8_;
      local_368._16_8_ = local_398._0_8_;
      local_f0._0_8_ = local_398._0_8_;
      local_f0._8_8_ = &local_508;
      local_f0._16_8_ = local_398._0_8_;
      local_d8 = &local_570;
      vVar8 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
              ::val((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                     *)local_530._vptr_TPZVec);
      local_608._0_8_ =
           vVar8 / ((*(double *)**(undefined8 **)&(local_530.fStore)->dx_ +
                    *(double *)(*(undefined8 **)&(local_530.fStore)->dx_)[1]) *
                   (**(double **)(local_530.fStore)->val_ +
                   *(double *)((_func_int **)(local_530.fStore)->val_)[1]));
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar16) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar16;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar16 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar17 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)local_530._vptr_TPZVec);
      uVar16 = *(uint *)(*(_func_int **)(local_530.fStore)->val_ + 8);
      uVar18 = *(uint *)(((_func_int **)(local_530.fStore)->val_)[1] + 8);
      if ((int)uVar18 < (int)uVar16) {
        uVar18 = uVar16;
      }
      uVar16 = *(uint *)(**(long **)&(local_530.fStore)->dx_ + 8);
      uVar22 = *(uint *)((*(long **)&(local_530.fStore)->dx_)[1] + 8);
      if ((int)uVar22 < (int)uVar16) {
        uVar22 = uVar16;
      }
      if ((int)uVar22 < (int)uVar18) {
        uVar22 = uVar18;
      }
      if ((int)uVar22 < (int)uVar17) {
        uVar22 = uVar17;
      }
      if (0 < (int)uVar22) {
        uVar27 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_530,(int)uVar27);
          (&pTStack_5f8->_vptr_TPZVec)[uVar27] = pp_Var7;
          uVar27 = uVar27 + 1;
        } while (uVar22 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)local_598;
      local_5c0.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_5c0);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_598);
    }
    if ((0.0 <= (double)local_5a0) && (0.0 <= local_510)) {
      local_508._vptr_TPZVec = (_func_int **)&local_530;
      local_530._vptr_TPZVec = (_func_int **)local_4b8;
      local_530.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
      local_508.fStore = (Fad<double> *)&local_5c0;
      local_5c0._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      pTStack_5f0 = &local_508;
      local_570.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_3b8.fStore = (Fad<double> *)&local_550;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_570.fNElements = (int64_t)&local_3b8;
      local_3b8._vptr_TPZVec = local_530._vptr_TPZVec;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_598,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_5c0.fStore = (Fad<double> *)((ulong)local_5c0.fStore & 0xffffffff00000000);
      local_5c0.fNElements = 0;
      local_5c0.fNAlloc = 0;
      local_398._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e8._0_8_ = local_398;
      local_398._0_8_ = local_5e8;
      local_550._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
      local_550.fNElements = 0;
      local_550.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e8;
      local_3b8._vptr_TPZVec = (_func_int **)(local_4e8 + 0x18);
      local_350 = (TPZVec<Fad<double>_> *)local_368;
      local_3b8.fStore = (Fad<double> *)(local_368 + 0x10);
      local_570._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_570.fStore = (Fad<double> *)((ulong)local_570.fStore & 0xffffffff00000000);
      local_570.fNElements = 0;
      local_570.fNAlloc = 0;
      local_328._0_8_ = local_f0 + 0x10;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_328._8_8_ = local_f0;
      local_f0._8_8_ = &local_508;
      local_530.fStore = (Fad<double> *)local_328;
      local_530._vptr_TPZVec = (_func_int **)&local_3b8;
      local_4e8._8_8_ = &local_550;
      local_4e8._24_8_ = &local_5c0;
      local_368._0_8_ = local_398._0_8_;
      local_368._8_8_ = local_398._8_8_;
      local_368._16_8_ = local_398._0_8_;
      local_f0._0_8_ = local_398._0_8_;
      local_f0._16_8_ = local_398._0_8_;
      local_d8 = &local_570;
      vVar8 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
              ::val((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                     *)&local_3b8);
      local_608._0_8_ =
           vVar8 / ((*(double *)**(undefined8 **)&(local_530.fStore)->dx_ +
                    *(double *)(*(undefined8 **)&(local_530.fStore)->dx_)[1]) *
                   (**(double **)(local_530.fStore)->val_ +
                   *(double *)((_func_int **)(local_530.fStore)->val_)[1]));
      uVar16 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_530);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar16) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar16;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar16 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar17 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)local_530._vptr_TPZVec);
      uVar16 = *(uint *)(*(_func_int **)(local_530.fStore)->val_ + 8);
      uVar18 = *(uint *)(((_func_int **)(local_530.fStore)->val_)[1] + 8);
      if ((int)uVar18 < (int)uVar16) {
        uVar18 = uVar16;
      }
      uVar16 = *(uint *)(**(long **)&(local_530.fStore)->dx_ + 8);
      uVar22 = *(uint *)((*(long **)&(local_530.fStore)->dx_)[1] + 8);
      if ((int)uVar22 < (int)uVar16) {
        uVar22 = uVar16;
      }
      if ((int)uVar22 < (int)uVar18) {
        uVar22 = uVar18;
      }
      if ((int)uVar22 < (int)uVar17) {
        uVar22 = uVar17;
      }
      if (0 < (int)uVar22) {
        uVar27 = 0;
        do {
          pp_Var7 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_530,(int)uVar27);
          (&pTStack_5f8->_vptr_TPZVec)[uVar27] = pp_Var7;
          uVar27 = uVar27 + 1;
        } while (uVar22 != uVar27);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_570);
      Fad<double>::~Fad((Fad<double> *)&local_550);
      Fad<double>::~Fad((Fad<double> *)&local_5c0);
      local_5c0._vptr_TPZVec = (_func_int **)local_598;
      local_5c0.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_5c0);
      goto LAB_01409c79;
    }
    goto LAB_01409c90;
  case EBoundaryLayer:
    pTStack_580 = (TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1);
    local_550._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_5c0.fStore = (Fad<double> *)local_5e8;
    stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    local_608._0_8_ = &local_5c0;
    local_608._8_8_ = (Fad<double> *)local_598;
    local_5c0._vptr_TPZVec = (_func_int **)&local_550;
    local_550.fStore = (Fad<double> *)pTStack_580;
    Fad<double>::
    Fad<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
              ((Fad<double> *)local_4b8,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                *)local_608);
    local_598._0_8_ = (Fad<double> *)0x4024000000000000;
    stack0xfffffffffffffa70 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_5c0.fNElements = (int64_t)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_608._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x4024000000000000;
    local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_550.fNElements = (int64_t)(local_230.super_TPZVec<Fad<double>_>.fStore + 1);
    local_5c0.fStore = (Fad<double> *)local_598;
    local_570._vptr_TPZVec = (_func_int **)&local_5c0;
    local_570.fStore = (Fad<double> *)&local_550;
    local_550.fStore = (Fad<double> *)local_608;
    local_5e8._0_8_ =
         FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
         ::val((FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                *)&local_570);
    pFVar13 = local_570.fStore;
    pp_Var7 = local_570._vptr_TPZVec;
    pFVar3 = (Fad<double> *)stack0xfffffffffffffa20;
    uVar16 = *(uint *)(*(long *)((long)local_570._vptr_TPZVec + 8) + 8);
    uVar18 = *(uint *)(*(double **)((long)local_570._vptr_TPZVec + 0x10) + 1);
    if ((int)*(uint *)(*(double **)((long)local_570._vptr_TPZVec + 0x10) + 1) < (int)uVar16) {
      uVar18 = uVar16;
    }
    uVar16 = *(uint *)(*(long *)&(local_570.fStore)->dx_ + 8);
    uVar17 = *(uint *)(*(double **)((long)local_570.fStore + 0x10) + 1);
    if ((int)*(uint *)(*(double **)((long)local_570.fStore + 0x10) + 1) < (int)uVar16) {
      uVar17 = uVar16;
    }
    if ((int)uVar17 < (int)uVar18) {
      uVar17 = uVar18;
    }
    stack0xfffffffffffffa20 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    if (0 < (int)uVar17) {
      uStack_5dc = SUB84(pFVar3,4);
      stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5dc,uVar17);
      FStack_5d8 = (FadCst<int>)operator_new__((ulong)uVar17 << 3);
    }
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    uVar16 = *(uint *)(*(long *)((long)pp_Var7 + 8) + 8);
    uVar18 = *(uint *)(*(double **)((long)pp_Var7 + 0x10) + 1);
    if ((int)uVar18 < (int)uVar16) {
      uVar18 = uVar16;
    }
    uVar16 = *(uint *)(*(long *)&pFVar13->dx_ + 8);
    uVar17 = *(uint *)(*(double **)((long)pFVar13 + 0x10) + 1);
    if ((int)uVar17 < (int)uVar16) {
      uVar17 = uVar16;
    }
    if ((int)uVar17 < (int)uVar18) {
      uVar17 = uVar18;
    }
    if (0 < (int)uVar17) {
      uVar27 = 0;
      do {
        vVar9 = FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                ::dx((FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                      *)&local_570,(int)uVar27);
        *(value_type *)((long)FStack_5d8 + uVar27 * 8) = vVar9;
        uVar27 = uVar27 + 1;
      } while (uVar17 != uVar27);
    }
    Fad<double>::~Fad((Fad<double> *)local_608);
    Fad<double>::~Fad((Fad<double> *)local_598);
    local_598._0_8_ = (TPZVec<Fad<double>_> *)0x41206a9400000000;
    stack0xfffffffffffffa70 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_5c0.fStore = (Fad<double> *)local_5e8;
    local_608._0_8_ = &local_5c0;
    local_608._8_8_ = (TPZVec<Fad<double>_> *)local_598;
    local_5c0._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_608);
    goto LAB_01409c83;
  case EBubble:
    local_508.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
    local_570._vptr_TPZVec = (_func_int **)&local_508;
    local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_570.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 2;
    local_550._vptr_TPZVec = (_func_int **)&local_570;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_550.fStore = (Fad<double> *)&local_530;
    local_530.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_5c0._vptr_TPZVec = (_func_int **)&local_550;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_5c0.fStore = (Fad<double> *)&local_3b8;
    local_3b8._vptr_TPZVec = (_func_int **)local_5e8;
    local_608._0_8_ = &local_5c0;
    local_4e8._24_8_ = local_598;
    local_598._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa70 = (TPZVec<Fad<double>_> *)((ulong)uStack_58c << 0x20);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_608._8_8_ = local_4e8 + 0x18;
    local_530._vptr_TPZVec = (_func_int **)local_4b8;
    local_4c8 = (TPZVec<Fad<double>_> *)local_570.fStore;
    local_3b8.fStore = local_508.fStore;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)local_608);
    goto LAB_01409c83;
  case EBubble2D:
    local_5c0.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
    local_608._0_8_ = &local_5c0;
    local_5c0._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_608._8_8_ = &local_550;
    local_550.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_598._0_8_ = local_608;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    unique0x00005300 = &local_570;
    local_570._vptr_TPZVec = (_func_int **)local_5e8;
    local_570.fStore = local_5c0.fStore;
    local_550._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)local_598);
    goto LAB_01409c90;
  case ESinCosCircle:
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x4010000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_598._0_8_ = local_398 + 0x10;
    unique0x00004e80 = (TPZVec<Fad<double>_> *)local_5e8;
    dVar30 = 4.0;
    local_4b8._0_8_ = pow((double)local_398._16_8_,4.0);
    uVar15 = local_4b8._8_8_;
    pFVar3 = (Fad<double> *)stack0xfffffffffffffa70;
    uVar11 = local_598._0_8_;
    uVar16 = ((Vector<double> *)(local_598._0_8_ + 8))->num_elts;
    uVar18 = (((Fad<double> *)stack0xfffffffffffffa70)->dx_).num_elts;
    if ((int)uVar18 < (int)uVar16) {
      uVar18 = uVar16;
    }
    local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    if (0 < (int)uVar18) {
      local_4b8._12_4_ = SUB84(uVar15,4);
      local_4b8._8_4_ = uVar18;
      pEStack_4a8 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar18 << 3);
    }
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    uVar16 = ((Vector<double> *)(uVar11 + 8))->num_elts;
    uVar18 = (pFVar3->dx_).num_elts;
    if ((int)uVar18 < (int)uVar16) {
      uVar18 = uVar16;
    }
    if (0 < (int)uVar18) {
      uVar27 = 0;
      do {
        vVar6 = FadBinaryPow<Fad<double>,_Fad<double>_>::dx
                          ((FadBinaryPow<Fad<double>,_Fad<double>_> *)local_598,(int)uVar27);
        *(value_type *)(pEStack_4a8 + uVar27 * 8) = vVar6;
        uVar27 = uVar27 + 1;
      } while (uVar18 != uVar27);
    }
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    pFVar3 = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_2b0.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar16 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_2b0.dx_.ptr_to_data = (double *)0x0;
    local_2b0.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_2b0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2b0.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_2b0.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar3 + 1))->fNAlloc;
    local_150.val_ = (local_230.super_TPZVec<Fad<double>_>.fStore)->val_;
    uVar16 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    local_150.dx_.ptr_to_data = (double *)0x0;
    local_150.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_150.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_150.dx_.ptr_to_data,
                 *(EVP_PKEY_CTX **)((long)local_230.super_TPZVec<Fad<double>_>.fStore + 0x10),
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_150.defaultVal = (local_230.super_TPZVec<Fad<double>_>.fStore)->defaultVal;
    atan2(local_150.defaultVal,dVar30);
    Fad<double>::~Fad(&local_150);
    Fad<double>::~Fad(&local_2b0);
    local_5c0.fStore = (Fad<double> *)local_598;
    local_598._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    stack0xfffffffffffffa70 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa70 & 0xffffffff00000000);
    pTStack_588 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_580 = (TPZVec<Fad<double>_> *)0x0;
    local_508.fStore = (Fad<double> *)&local_5c0;
    local_570._vptr_TPZVec = (_func_int **)&local_508;
    local_550.fStore = (Fad<double> *)local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_570.fStore = (Fad<double> *)&local_550;
    local_5c0.fNElements = (int64_t)local_5e8;
    local_550.fNElements = (int64_t)local_5e8;
    local_508._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)&local_570);
LAB_01409c79:
    Fad<double>::~Fad((Fad<double> *)local_608);
LAB_01409c83:
    Fad<double>::~Fad((Fad<double> *)local_598);
    goto LAB_01409c90;
  case EHarmonic:
    local_498 = *(TPZVec<Fad<double>_> **)(uVar11 + 8);
    pEStack_4a8 = (EVP_PKEY_CTX *)0x400921fb54442d18;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5c8 = local_498 + 1;
    FStack_5d8.constant_ = 0x54442d18;
    FStack_5d8.defaultVal = 0x400921fb;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    unique0x00004e80 = (TPZVec<Fad<double>_> *)local_5e8;
    local_598._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_598);
    break;
  case EHarmonic2:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3fd0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff921fb54442d18;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_5c0.fStore = *(Fad<double> **)(uVar11 + 8);
    local_530._vptr_TPZVec = (_func_int **)&local_3b8;
    local_530.fStore = (Fad<double> *)local_598;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)local_5e8;
    local_508._vptr_TPZVec = (_func_int **)&local_530;
    local_608._8_8_ = (TPZVec<Fad<double>_> *)local_5c0.fStore + 1;
    local_508.fStore = (Fad<double> *)local_608;
    local_570._vptr_TPZVec = (_func_int **)&local_508;
    local_4e8._0_8_ = local_398;
    local_4e8._8_8_ = &local_5c0;
    local_4e8._24_8_ = local_4e8;
    local_4c8 = &local_550;
    local_570.fStore = (Fad<double> *)(local_4e8 + 0x18);
    local_5c0.fNElements = (int64_t)pTStack_5f8;
    unique0x10006832 = (TPZVec<Fad<double>_> *)local_5c0.fStore;
    pTStack_588 = pTStack_5f8;
    local_550.fStore = (Fad<double> *)local_608._8_8_;
    local_550.fNElements = (int64_t)pTStack_5f8;
    local_3b8._vptr_TPZVec = (_func_int **)local_5c0.fStore;
    local_3b8.fStore = (Fad<double> *)local_4b8;
    local_398._0_8_ = local_608._8_8_;
    local_398._8_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_570);
LAB_01409c90:
    Fad<double>::~Fad((Fad<double> *)local_5e8);
LAB_01409c9a:
    pTVar23 = (TPZVec<Fad<double>_> *)local_4b8;
LAB_0140a23b:
    Fad<double>::~Fad((Fad<double> *)pTVar23);
    break;
  case ESquareRootUpper:
    local_5e8._0_8_ = *(undefined8 *)(uVar11 + 8);
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    local_4b8._8_8_ = local_5e8;
    local_608._8_8_ = local_608._0_8_;
    unique0x1000678a = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              ((Fad<double> *)local_598,
               (FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)local_4b8);
    lVar24 = *(long *)(uVar11 + 8);
    local_328._24_8_ = *(int64_t *)(lVar24 + 0x20);
    uVar16 = *(uint *)(lVar24 + 0x28);
    local_300 = (MEM_CPY<double> *)0x0;
    local_308 = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_300 = (MEM_CPY<double> *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                (local_300,*(EVP_PKEY_CTX **)(lVar24 + 0x30),(EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_2f8 = *(undefined8 *)(lVar24 + 0x38);
    pdVar20 = *(double **)(uVar11 + 8);
    local_1b0.val_ = *pdVar20;
    uVar16 = *(uint *)(pdVar20 + 1);
    local_1b0.dx_.ptr_to_data = (double *)0x0;
    local_1b0.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_1b0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_1b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar20[2],
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_1b0.defaultVal = pdVar20[3];
    atan2(local_1b0.defaultVal,dVar30);
    Fad<double>::~Fad(&local_1b0);
    Fad<double>::~Fad((Fad<double> *)(local_328 + 0x18));
    uVar11 = local_608._8_8_;
    local_d0.val_ = (double)local_608._0_8_;
    local_d0.dx_.num_elts = local_608._8_4_;
    local_d0.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_608._8_4_ != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)local_608._8_4_) {
        uVar27 = (long)(int)local_608._8_4_ * 8;
      }
      local_d0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_d0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_5f8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_d0.defaultVal = (double)pTStack_5f0;
    local_5a0 = (TPZVec<Fad<double>_> *)local_d0.val_;
    Fad<double>::~Fad(&local_d0);
    if ((double)local_5a0 < 0.0) {
      local_608._0_8_ = (double)local_608._0_8_ + 6.283185307179586;
    }
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_598);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_550._vptr_TPZVec = (_func_int **)&local_5c0;
    local_5c0.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_5c0.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006792 = (TPZVec<Fad<double>_> *)local_608;
    local_5c0.fNAlloc = (int64_t)local_4b8;
    local_550.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_550);
    goto LAB_0140999f;
  case ESquareRootLower:
    local_5e8._0_8_ = *(undefined8 *)(uVar11 + 8);
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    local_4b8._8_8_ = local_5e8;
    local_608._8_8_ = local_608._0_8_;
    unique0x1000677a = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              ((Fad<double> *)local_598,
               (FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)local_4b8);
    lVar24 = *(long *)(uVar11 + 8);
    local_2f0.val_ = *(double *)(lVar24 + 0x20);
    uVar16 = *(uint *)(lVar24 + 0x28);
    local_2f0.dx_.ptr_to_data = (double *)0x0;
    local_2f0.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_2f0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2f0.dx_.ptr_to_data,*(EVP_PKEY_CTX **)(lVar24 + 0x30),
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_2f0.defaultVal = *(double *)(lVar24 + 0x38);
    pdVar20 = *(double **)(uVar11 + 8);
    local_190.val_ = *pdVar20;
    uVar16 = *(uint *)(pdVar20 + 1);
    local_190.dx_.ptr_to_data = (double *)0x0;
    local_190.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_190.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_190.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar20[2],
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_190.defaultVal = pdVar20[3];
    atan2(local_190.defaultVal,dVar30);
    Fad<double>::~Fad(&local_190);
    Fad<double>::~Fad(&local_2f0);
    uVar11 = local_608._8_8_;
    local_b0.val_ = (double)local_608._0_8_;
    local_b0.dx_.num_elts = local_608._8_4_;
    local_b0.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_608._8_4_ != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)local_608._8_4_) {
        uVar27 = (long)(int)local_608._8_4_ * 8;
      }
      local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_5f8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_b0.defaultVal = (double)pTStack_5f0;
    local_5a0 = (TPZVec<Fad<double>_> *)local_b0.val_;
    Fad<double>::~Fad(&local_b0);
    if (0.0 < (double)local_5a0) {
      local_608._0_8_ = (double)local_608._0_8_ + -6.283185307179586;
    }
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_598);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_550._vptr_TPZVec = (_func_int **)&local_5c0;
    local_5c0.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_5c0.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006782 = (TPZVec<Fad<double>_> *)local_608;
    local_5c0.fNAlloc = (int64_t)local_4b8;
    local_550.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_550);
    goto LAB_0140999f;
  case ESquareRoot:
    local_5e8._0_8_ = *(undefined8 *)(uVar11 + 8);
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    local_4b8._8_8_ = local_5e8;
    local_608._8_8_ = local_608._0_8_;
    unique0x1000676a = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              ((Fad<double> *)local_598,
               (FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)local_4b8);
    lVar24 = *(long *)(uVar11 + 8);
    local_2d0.val_ = *(double *)(lVar24 + 0x20);
    uVar16 = *(uint *)(lVar24 + 0x28);
    local_2d0.dx_.ptr_to_data = (double *)0x0;
    local_2d0.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_2d0.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2d0.dx_.ptr_to_data,*(EVP_PKEY_CTX **)(lVar24 + 0x30),
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_2d0.defaultVal = *(double *)(lVar24 + 0x38);
    pdVar20 = *(double **)(uVar11 + 8);
    local_170.val_ = *pdVar20;
    uVar16 = *(uint *)(pdVar20 + 1);
    local_170.dx_.ptr_to_data = (double *)0x0;
    local_170.dx_.num_elts = uVar16;
    if ((long)(int)uVar16 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        uVar27 = (long)(int)uVar16 * 8;
      }
      local_170.dx_.ptr_to_data = (double *)operator_new__(uVar27);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_170.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar20[2],
                 (EVP_PKEY_CTX *)(ulong)uVar16);
    }
    local_170.defaultVal = pdVar20[3];
    atan2(local_170.defaultVal,dVar30);
    Fad<double>::~Fad(&local_170);
    Fad<double>::~Fad(&local_2d0);
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_598);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_550._vptr_TPZVec = (_func_int **)&local_5c0;
    local_5c0.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_5c0.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006772 = (TPZVec<Fad<double>_> *)local_608;
    local_5c0.fNAlloc = (int64_t)local_4b8;
    local_550.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_550);
LAB_0140999f:
    pTVar23 = (TPZVec<Fad<double>_> *)(local_4b8 + 8);
LAB_0140a224:
    Fad<double>::~Fad((Fad<double> *)pTVar23);
    Fad<double>::~Fad((Fad<double> *)local_608);
    pTVar23 = (TPZVec<Fad<double>_> *)local_598;
    goto LAB_0140a23b;
  case ELaplace2D:
    Fad<double>::Fad((Fad<double> *)&local_5c0);
    pFVar3 = disp->fStore;
    pFVar3->val_ = 1.0;
    if ((pFVar3->dx_).num_elts != 0) {
      local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar3->dx_,(double *)local_4b8);
    }
    if (0 < this->fmaxIter) {
      pTVar23 = (TPZVec<Fad<double>_> *)0x1;
      local_328._16_8_ = this;
      do {
        local_5a0 = (TPZVec<Fad<double>_> *)(double)(int)pTVar23;
        local_550._vptr_TPZVec = (_func_int **)((double)local_5a0 * 3.141592653589793);
        local_550.fStore = (Fad<double> *)((ulong)local_550.fStore & 0xffffffff00000000);
        local_550.fNElements = 0;
        local_550.fNAlloc = 0;
        FadFuncTanh<Fad<double>_>::FadFuncTanh
                  ((FadFuncTanh<Fad<double>_> *)local_5e8,(Fad<double> *)&local_550);
        FadExpr<FadFuncTanh<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncTanh<Fad<double>_>_> *)local_4b8,
                   (FadFuncTanh<Fad<double>_> *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        local_4c8 = (TPZVec<Fad<double>_> *)0xfffffffe;
        local_4c0 = (FadExpr<FadFuncTanh<Fad<double>_>_> *)local_4b8;
        FadFuncCos<Fad<double>_>::FadFuncCos
                  ((FadFuncCos<Fad<double>_> *)local_598,(Fad<double> *)&local_550);
        FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_5e8,
                   (FadFuncCos<Fad<double>_> *)local_598);
        Fad<double>::~Fad((Fad<double> *)local_598);
        local_530.fStore = (Fad<double> *)0x3fb9f02f6222c722;
        local_530.fNElements = 0;
        local_508.fStore = (Fad<double> *)0x3fb9f02f6222c722;
        local_508.fNElements = 0;
        local_508.fNAlloc = (int64_t)&local_530;
        local_530.fNAlloc = (int64_t)local_5e8;
        FadFuncSin<Fad<double>_>::FadFuncSin
                  ((FadFuncSin<Fad<double>_> *)local_608,(Fad<double> *)&local_550);
        FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_598,
                   (FadFuncSin<Fad<double>_> *)local_608);
        Fad<double>::~Fad((Fad<double> *)local_608);
        local_3b8.fStore = (Fad<double> *)((double)local_5a0 * 0.1591549430918954);
        local_3b8.fNElements = 0;
        local_368._16_8_ = &local_508;
        local_350 = &local_3b8;
        local_398._0_8_ = local_4e8 + 0x18;
        local_398._8_8_ = local_368 + 0x10;
        local_608._0_8_ = local_368;
        local_4e8._0_8_ = local_398;
        local_608._8_8_ = pTVar23;
        local_4e8._8_8_ = (TPZVec<Fad<double>_> *)local_608;
        local_3b8.fNAlloc = (int64_t)local_598;
        local_368._0_8_ = &local_550;
        local_368._8_8_ = pTVar23;
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,FadExpr<FadFuncTanh<Fad<double>>>>>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncCos<Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSin<Fad<double>>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<int>>>,FadCst<int>>>>>
                  ((Fad<double> *)&local_570,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
                    *)local_4e8);
        Fad<double>::~Fad((Fad<double> *)(local_598 + 8));
        Fad<double>::~Fad((Fad<double> *)(local_5e8 + 8));
        Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
        FadFuncCosh<Fad<double>_>::FadFuncCosh
                  ((FadFuncCosh<Fad<double>_> *)local_5e8,(Fad<double> *)&local_550);
        FadExpr<FadFuncCosh<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncCosh<Fad<double>_>_> *)local_4b8,
                   (FadFuncCosh<Fad<double>_> *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        FStack_5d8 = *(FadCst<int> *)(local_4e8._16_8_ + 8);
        local_508._vptr_TPZVec = (_func_int **)&local_530;
        local_3b8._vptr_TPZVec = (_func_int **)((long)FStack_5d8 + 0x20);
        local_3b8.fStore = (Fad<double> *)0x1;
        pTStack_588 = &local_3b8;
        local_608._0_8_ = &local_508;
        local_608._8_8_ = local_598;
        unique0x10006762 = &local_550;
        unique0x1000682a = &local_550;
        local_530._vptr_TPZVec = (_func_int **)&local_570;
        local_530.fStore = (Fad<double> *)local_4b8;
        local_508.fStore = (Fad<double> *)local_5e8;
        Fad<double>::operator+=
                  (disp->fStore,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
                    *)local_608);
        Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
        Fad<double>::~Fad((Fad<double> *)&local_570);
        Fad<double>::~Fad((Fad<double> *)&local_550);
        bVar4 = (long)pTVar23 < (long)*(int *)(local_328._16_8_ + 0x210);
        pTVar23 = (TPZVec<Fad<double>_> *)((long)&pTVar23->_vptr_TPZVec + 1);
      } while (bVar4);
    }
    pTVar23 = &local_5c0;
    goto LAB_0140a23b;
  default:
    pFVar3 = disp->fStore;
    pFVar3->val_ = 0.0;
    if ((pFVar3->dx_).num_elts != 0) {
      local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar3->dx_,(double *)local_4b8);
    }
  }
  Fad<double>::~Fad((Fad<double> *)(local_398 + 0x10));
  Fad<double>::~Fad((Fad<double> *)&local_348);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_230);
  return;
}

Assistant:

void TLaplaceExample1::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &disp) const
{
    TPZManVector<TVar,3> xloc(x);
    for (int i = 0; i<xloc.size(); i++) {
        xloc[i] -= fCenter[i];
    }
    TVar r2 = 0.;
    for (int i=0; i<fDimension; i++) {
        r2 += xloc[i]*xloc[i];
    }
    TVar r = sqrt(r2);
    disp[0] = xloc[0]*(TVar)(0.);
    
    REAL xval[2] = {shapeFAD::val(x[0]),shapeFAD::val(x[1])};
     
    switch (fExact) {
        case EConst:
            disp[0] += gC;
            break;
        case EX:
            disp[0] += xloc[0];
            break;
        case ESinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]);
        }
            break;
        case E10SinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*10.);
        }
            break;
            
            case E2SinSin:
            {
                disp[0] += (TVar)(1.);
                for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*2.);
            }
                break;
        case ESinDist:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*1.1);
        }
            break;
        case ECosCos:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= cos((TVar)M_PI*xloc[i]/2);
        }
            break;
        case EArcTan://(1+0.3sin(10Pi x))*(1+0.5cos(10Pi r)*arctan(100*(r-0.5))
        {
            TVar atanco = (r-(TVar)0.5)*100.;
            TVar freq = 10.;
            TVar mult = (TVar(1)+TVar(0.3)*sin(TVar(M_PI)*xloc[0]*freq))*(TVar(1)+TVar(0.5)*cos(TVar(M_PI)*r*freq));
            disp[0] = atan(atanco)*mult;
        }
            break;
        case EArcTanSingular://5*(0.5*pi + arctang(20(0.25 - r^2))))
        {
            REAL B = 5.;
            if(fDimension==1)
                B *= 0.25;
            else if(fDimension==3)
                B *= 4;
            // Argument value (arc) to compute ArcTangent( arc )
            TVar RCircle = 0.5;
            TVar Force = 20.;
            TVar arc = Force*(RCircle*RCircle-r2);
            TVar Prod = 1.;
            for (int i=0; i<fDimension; i++) {
                Prod *= x[i]*(1.-x[i]);
            }
            TVar temp = 0.5*M_PI + atan(arc);
            disp[0] = B*temp;
        }
            break;
            
            //----
        case ESinMark://(r^(2/3)-r^2)sin(20/3) para homogeneo dirichlet e r^(2/3)sin(20/3) para f=0
        {

            TVar theta = atan2(xloc[1], xloc[0]);//theta=arctan(y/x)
            auto thetaval = shapeFAD::val(theta);
            if (thetaval < (0.)) theta += 2. * M_PI;

            // Verification to avoid numerical errors when x > 0 and y = 0
            if (xval[0] > 0 && xval[1] < 1e-15 && xval[1] > -1.e-15) {
               disp[0] = 0.;
            }
            else {
                TVar factor = pow(r,TVar (2.)/TVar (3.));//pow(r,TVar (2.)/TVar (3.))-pow(r,TVar (2.));//
                disp[0] = factor * (sin((TVar) (2.) * theta / TVar(3.)));
            }


        }
            break;
            
            //--
     
        case ESinSinDirNonHom: //sin(2 pi x)sin(2pi y)+1/(x+y+1)
        {
            
            disp[0]=(sin((TVar)M_PI*2.*xloc[0]))*sin((TVar)M_PI*2.*xloc[1])+(TVar)1./(xloc[0]+xloc[1]+(TVar)(1.));
            
        }
            
            break;
            
        case ESteklovNonConst://Steklov function for eigenvalue lambda=0.53544094560246 and permeability Omega1=Omega=3, Omega2=Omega4=5
        {
            TVar coefs[] = {1., 0.44721359549995787, 2.3333333333333326,
                -0.7453559924999296, 0.5555555555555556,
                -0.9441175904999111, -0.48148148148148173,
                -2.4017026424997736};
            TVar lambda = 0.53544094560246;
            TVar t = atan2(xloc[1], xloc[0]);
            REAL tval = shapeFAD::val(t);
            if(tval < (0.)) t += 2.*M_PI;
            
            if((xval[0] >=(0.)) && (xval[1] >=(0.))){
               // std::cout<<"1o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]=pow(r, lambda)*(TVar(coefs[0])*cos(lambda *t) + TVar(coefs[1])*sin(lambda*t) );
               // std::cout<<"valor da funcao no 1o. Q "<<disp[0]<<std::endl;
               // disp[0]=pow(r, lambda)*(cos(lambda *t)+TVar(-1.)*TVar(0.1)*sin(lambda*t));
                
            }
            
            if(( xval[0] <= (0.)) && (xval[1] >=(0.))){
               // std::cout<<"2o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]= pow(r, lambda)*(TVar(coefs[2])*cos(lambda*t) + TVar(coefs[3])*sin(lambda* t));
                
             //    std::cout<<"valor da funcao no 2o. Q "<<disp[0]<<std::endl;
            }
            
            if((xval[0] <(0.)) && ( xval[1] <= (0.))){
               // std::cout<<"3o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                disp[0]= pow(r, lambda)*(TVar(coefs[4] )*cos(lambda*t) + TVar(coefs[5])*sin(lambda* t));
                //disp[0]= pow(r, lambda)*(TVar(-1.)*TVar(0.882757 )*cos(lambda*t) + TVar(-1.)*TVar(0.480355)*sin(lambda* t));
              //   std::cout<<"valor da funcao no 3o. Q "<<disp[0]<<std::endl;
            }
            if(( xval[0] >= (0.)) && ( xval[1] < (0.))){
              //  std::cout<<"4o. Q "<<xloc<< " r " << r << " th " << t << std::endl;

                disp[0]= pow(r, lambda)*(TVar(coefs[6])*cos(lambda*t) +  TVar(coefs[7])*sin(lambda* t));
                
               // std::cout<<"valor da funcao no 4o. Q "<<disp[0]<<std::endl;
                
            }
            
            
        }
            break;
            
            case EGalvisNonConst:
        {
            
            TVar k1 = 2;
            TVar k2 = 5;
            
            
            if((xval[0] <= (0.)) && (xval[1] <= (0.))){
                
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+1.));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"3o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if(( xval[0] > (0.)) && (xval[1] < (0.))){
             
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1 + TVar(1.)));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"4o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if((xval[0] < (0.)) && ( xval[1] >= (0.))){
              
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"2o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            if(( xval[0] >= (0.)) && ( xval[1] >= (0.))){
               
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
            //    std::cout<<"1o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
                
            }
            
            
        }
            break;
            
        case EBoundaryLayer:{
            TVar term1 = xloc[0]*xloc[1]*(1.-xloc[0])*(1.-xloc[1]);
            TVar term2 = exp(TVar(10.)*xloc[0])*exp(TVar(10.)*xloc[1]);
            TVar factor = TVar(537930);
            
            disp[0] = (term1*term2)/factor;
            
          //  std::cout<<"Pto "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
            
            
        }
            break;
            
        case EBubble:{
            
            disp[0] = xloc[0]*xloc[1]*xloc[2]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1])*(TVar(1.)-xloc[2]);
           // std::cout<<"pto "<<xloc <<" f(x) "<<disp<<std::endl;
        }
            break;
        case EBubble2D:{

            disp[0] = xloc[0]*xloc[1]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1]);
        }
            break;
        case ESinCosCircle:{
            
            TVar coef = pow(r, TVar(4.));
            TVar theta=atan2(xloc[1],xloc[0]);
            disp[0] = coef*sin(TVar(2.)*theta)*cos(TVar(2.)*theta);
            
            
        }
            break;
        case EHarmonic:
            disp[0] = exp(M_PI*x[0])*sin(M_PI*x[1]);
            break;

        case EHarmonic2:
        {
            TVar a1 = 1./4;
            TVar alpha = M_PI/2;
            disp[0] = x[0]*a1*cos(x[0]*alpha)*cosh(x[1]*alpha) + x[1]*a1*sin(x[0]*alpha)*sinh(x[1]*alpha);
        }
            break;
        case ESquareRoot:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootLower:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) > 0.) {
                theta -= (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootUpper:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) < 0.) {
                theta += (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ELaplace2D:
        {
            TVar Ck;
            disp[0] = 1.;
            for(int k = 1 ; k < fmaxIter+1; k++){
                TVar kpi = k*M_PI;
                TVar ck = -2/tanh(kpi)*(0.1013211836423378 -0.1013211836423378*cos(kpi)-0.1591549430918954 *k* sin(kpi))/(kpi*k*k);
                disp[0]+=ck/cosh(kpi)*cos(kpi*x[0])*cosh(kpi*(x[1]-1));
            }
        }
            break;

        default:
            disp[0] = 0.;
            break;
    }
}